

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O2

void renderSceneProgressive(void)

{
  (*glad_glBindFramebuffer)(0x8d40,g_gl.framebuffers[1]);
  (*glad_glViewport)(0,0,g_framebuffer.w,g_framebuffer.h);
  (*glad_glDepthFunc)(0x201);
  (*glad_glEnable)(0xb71);
  (*glad_glEnable)(0xb44);
  if (g_framebuffer.flags.reset == true) {
    (*glad_glClearColor)(0.0,0.0,0.0,(float)g_framebuffer.samplesPerPass);
    (*glad_glClear)(0x4100);
    g_framebuffer.pass = 0;
    g_framebuffer.flags.reset = false;
  }
  else if (0 < g_framebuffer.pass) {
    (*glad_glDepthFunc)(0x203);
    (*glad_glEnable)(0xbe2);
    (*glad_glBlendFunc)(1,1);
    loadRandomBuffer();
    goto LAB_0014b59d;
  }
  (*glad_glDepthFunc)(0x201);
  (*glad_glDisable)(0xbe2);
LAB_0014b59d:
  if (g_framebuffer.samplesPerPass * g_framebuffer.pass < g_framebuffer.samplesPerPixel) {
    if (g_sphere.flags.showLines == true) {
      (*glad_glPolygonMode)(0x408,0x1b01);
    }
    (*glad_glUseProgram)(g_gl.programs[2]);
    (*glad_glBindVertexArray)(g_gl.vertexArrays[1]);
    (*glad_glDrawElements)(4,g_sphere.sphere.indexCnt,0x1403,(void *)0x0);
    if (g_sphere.flags.showLines == true) {
      (*glad_glPolygonMode)(0x408,0x1b02);
    }
    (*glad_glUseProgram)(g_gl.programs[1]);
    (*glad_glBindVertexArray)(g_gl.vertexArrays[0]);
    (*glad_glDrawArrays)(5,0,4);
    g_framebuffer.pass = g_framebuffer.pass + 1;
  }
  if (0 < g_framebuffer.pass) {
    (*glad_glDepthFunc)(0x201);
    (*glad_glDisable)(0xbe2);
  }
  (*glad_glDisable)(0xb44);
  (*glad_glDisable)(0xb71);
  return;
}

Assistant:

void renderSceneProgressive()
{
    // configure GL state
    glBindFramebuffer(GL_FRAMEBUFFER, g_gl.framebuffers[FRAMEBUFFER_SCENE]);
    glViewport(0, 0, g_framebuffer.w, g_framebuffer.h);
    glDepthFunc(GL_LESS);
    glEnable(GL_DEPTH_TEST);
    glEnable(GL_CULL_FACE);

    if (g_framebuffer.flags.reset) {
        glClearColor(0, 0, 0, g_framebuffer.samplesPerPass);
        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
        g_framebuffer.pass = 0;
        g_framebuffer.flags.reset = false;
    }

    // enable blending only after the first is complete
    // (otherwise backfaces might be included in the rendering)
    if (g_framebuffer.pass > 0) {
        glDepthFunc(GL_LEQUAL);
        glEnable(GL_BLEND);
        glBlendFunc(GL_ONE, GL_ONE);
        loadRandomBuffer();
    } else {
        glDepthFunc(GL_LESS);
        glDisable(GL_BLEND);
    }

    // stop progressive drawing once the desired sampling rate has been reached
    if (g_framebuffer.pass * g_framebuffer.samplesPerPass
        < g_framebuffer.samplesPerPixel) {

        // draw planets
        if (g_sphere.flags.showLines)
            glPolygonMode(GL_FRONT_AND_BACK, GL_LINE);

        glUseProgram(g_gl.programs[PROGRAM_SPHERE]);
        glBindVertexArray(g_gl.vertexArrays[VERTEXARRAY_SPHERE]);
        glDrawElements(GL_TRIANGLES,
                       g_sphere.sphere.indexCnt,
                       GL_UNSIGNED_SHORT,
                       NULL);

        if (g_sphere.flags.showLines)
            glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);

        // draw background
        glUseProgram(g_gl.programs[PROGRAM_BACKGROUND]);
        glBindVertexArray(g_gl.vertexArrays[VERTEXARRAY_EMPTY]);
        glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

        ++g_framebuffer.pass;
    }

    // restore GL state
    if (g_framebuffer.pass > 0) {
        glDepthFunc(GL_LESS);
        glDisable(GL_BLEND);
    }
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
}